

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O0

int control(char *a)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ssize_t sVar4;
  char *a_local;
  
  iVar1 = svstatus_get();
  if (iVar1 < 1) {
    a_local._4_4_ = -1;
  }
  else if ((svstatus[0x11] == *a) && ((*a != 'd' || (svstatus[0x12] == '\x01')))) {
    a_local._4_4_ = 0;
  }
  else {
    iVar1 = open_write("supervise/control");
    fd = iVar1;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == error_nodevice) {
        if (*a == 'x') {
          ok("runsv not running");
        }
        else {
          failx("runsv not running");
        }
      }
      else {
        warn("unable to open supervise/control");
      }
      a_local._4_4_ = -1;
    }
    else {
      uVar2 = str_len(a);
      sVar4 = write(iVar1,a,(ulong)uVar2);
      r = (int)sVar4;
      close(fd);
      iVar1 = r;
      uVar2 = str_len(a);
      if (iVar1 == uVar2) {
        a_local._4_4_ = 1;
      }
      else {
        warn("unable to write to supervise/control");
        a_local._4_4_ = -1;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int control(char *a) {
  if (svstatus_get() <= 0) return(-1);
  if (svstatus[17] == *a)
    if (*a != 'd' || svstatus[18] == 1) return(0); /* once w/o term */
  if ((fd =open_write("supervise/control")) == -1) {
    if (errno != error_nodevice)
      warn("unable to open supervise/control");
    else
      *a == 'x' ? ok("runsv not running") : failx("runsv not running");
    return(-1);
  }
  r =write(fd, a, str_len(a));
  close(fd);
  if (r != str_len(a)) {
    warn("unable to write to supervise/control");
    return(-1);
  }
  return(1);
}